

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall
van_kampen::Graph::mergeNodes
          (Graph *this,nodeId_t alive,nodeId_t dead,
          unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *untouchable)

{
  _Elt_pointer pTVar1;
  _Elt_pointer pTVar2;
  Node *pNVar3;
  size_type sVar4;
  _Elt_pointer pTVar5;
  _Map_pointer ppTVar6;
  _Elt_pointer pTVar7;
  _Elt_pointer pTVar8;
  _Elt_pointer __k;
  nodeId_t local_3c;
  _Map_pointer local_38;
  
  local_3c = dead;
  pNVar3 = node(this,dead);
  __k = (pNVar3->transitions_).
        super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur;
  pTVar8 = (pNVar3->transitions_).
           super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
  local_38 = (pNVar3->transitions_).
             super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  pTVar1 = (pNVar3->transitions_).
           super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (__k != pTVar1) {
    sVar4 = std::
            _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&untouchable->_M_h,&__k->to);
    if (sVar4 == 0) {
      pNVar3 = node(this,alive);
      Node::addTransition(pNVar3,__k->to,&__k->label,false,false);
      pNVar3 = node(this,__k->to);
      pTVar5 = (pNVar3->transitions_).
               super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
      pTVar7 = (pNVar3->transitions_).
               super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last;
      ppTVar6 = (pNVar3->transitions_).
                super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node;
      pTVar2 = (pNVar3->transitions_).
               super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      while (pTVar5 != pTVar2) {
        if (pTVar5->to == local_3c) {
          pTVar5->to = alive;
        }
        pTVar5 = pTVar5 + 1;
        if (pTVar5 == pTVar7) {
          pTVar5 = ppTVar6[1];
          ppTVar6 = ppTVar6 + 1;
          pTVar7 = pTVar5 + 7;
        }
      }
    }
    __k = __k + 1;
    if (__k == pTVar8) {
      __k = local_38[1];
      local_38 = local_38 + 1;
      pTVar8 = __k + 7;
    }
  }
  std::__detail::
  _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)&this->removedNodes_,&local_3c);
  return;
}

Assistant:

void Graph::mergeNodes(nodeId_t alive, nodeId_t dead, const std::unordered_set<nodeId_t> &untouchable)
{
    for (Transition &edgeFromDead : node(dead).transitions())
    {
        if (untouchable.count(edgeFromDead.to))
        {
            continue;
        }
        node(alive).addTransition(edgeFromDead.to, edgeFromDead.label, false, false); // TODO
        for (Transition &edge : node(edgeFromDead.to).transitions())
        {
            if (edge.to == dead)
            {
                edge.to = alive;
            }
        }
    }
    removedNodes_.insert(dead);
}